

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O1

void __thiscall
FileParse::Child<std::optional<double>_>::Child
          (Child<std::optional<double>_> *this,string *nodeName,optional<double> *data,size_t index)

{
  pointer pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (nodeName->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + nodeName->_M_string_length);
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->nodeNames,__l,&local_49);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this->data = data;
  this->index = index;
  return;
}

Assistant:

Child(const std::string & nodeName, T & data, size_t index = 0u) :
            nodeNames({nodeName}), data(data), index(index)
        {}